

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SingularFieldHelper<10>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  ArrayOutput *in_RDX;
  undefined8 in_RSI;
  void *in_RDI;
  uint32 tag;
  
  tag = (uint32)((ulong)in_RSI >> 0x20);
  WriteTagTo<google::protobuf::internal::ArrayOutput>(tag,in_RDX);
  Get<google::protobuf::MessageLite_const*>(in_RDI);
  SerializeGroupTo<google::protobuf::internal::ArrayOutput>((MessageLite *)field,md,output);
  WriteTagTo<google::protobuf::internal::ArrayOutput>(tag,in_RDX);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeGroupTo(Get<const MessageLite*>(field),
                     static_cast<const SerializationTable*>(md.ptr), output);
    WriteTagTo(md.tag + 1, output);
  }